

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SetPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_2UL> *pJVar2;
  Var instance;
  RecyclableObject *pRVar3;
  Var aValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,2ul>,(TTD::NSLogEvents::EventKind)59>
                       (evt);
    instance = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
    if (instance != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(instance);
      if (BVar1 != 0) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
        aValue = InflateVarInReplay(executeContext,pJVar2->VarArray[1]);
        if (aValue != (Var)0x0) {
          if ((ulong)aValue >> 0x30 == 0) {
            pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue);
            if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
            }
          }
          Js::JavascriptOperators::OP_SetProperty
                    (instance,(PropertyId)pJVar2->ScalarArray[0],aValue,scriptContext,
                     (PropertyValueInfo *)0x0,(uint)(pJVar2->ScalarArray[1] != 0),(Var)0x0);
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void SetPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarDoubleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarDoubleScalarArgumentAction, EventKind::SetPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var value = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(value, ctx);

            Js::JavascriptOperators::OP_SetProperty(var, GetPropertyIdItem(action), value, ctx, nullptr, GetScalarItem_1(action) ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);
        }